

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cards.cpp
# Opt level: O2

void __thiscall Deck::createDeck(Deck *this)

{
  uint uVar1;
  vector<CardType,_std::allocator<CardType>_> *this_00;
  vector<CardType,_std::allocator<CardType>_> deck;
  random_device local_2728;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13a0;
  
  populateDeck(&deck,this);
  std::random_device::random_device(&local_2728);
  uVar1 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&local_13a0,(ulong)uVar1);
  std::
  shuffle<__gnu_cxx::__normal_iterator<CardType*,std::vector<CardType,std::allocator<CardType>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
            ((__normal_iterator<CardType_*,_std::vector<CardType,_std::allocator<CardType>_>_>)
             deck.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<CardType_*,_std::vector<CardType,_std::allocator<CardType>_>_>)
             deck.super__Vector_base<CardType,_std::allocator<CardType>_>._M_impl.
             super__Vector_impl_data._M_finish,&local_13a0);
  std::random_device::~random_device(&local_2728);
  this_00 = (vector<CardType,_std::allocator<CardType>_> *)operator_new(0x18);
  std::vector<CardType,_std::allocator<CardType>_>::vector(this_00,&deck);
  this->deckPointer = this_00;
  std::_Vector_base<CardType,_std::allocator<CardType>_>::~_Vector_base
            (&deck.super__Vector_base<CardType,_std::allocator<CardType>_>);
  return;
}

Assistant:

void Deck::createDeck() {
    std::vector<CardType> deck = Deck::populateDeck();
    std::shuffle(deck.begin(), deck.end(), std::mt19937(std::random_device()()));
    deckPointer = new std::vector<CardType>(deck); //store value on the heap to avoid losing it
}